

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,char *binDir)

{
  bool bVar1;
  long lVar2;
  unsigned_long uVar3;
  char *pcVar4;
  iterator iVar5;
  ulong dindex;
  Directory dir;
  string fullPath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  string m;
  string bdir;
  Directory DStack_d8;
  cmCoreTryCompile *local_d0;
  char *local_c8;
  string local_c0;
  undefined1 local_a0 [32];
  _Base_ptr local_80;
  size_t local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  if (binDir != (char *)0x0) {
    local_d0 = this;
    std::__cxx11::string::string(local_50,binDir,(allocator *)local_a0);
    lVar2 = std::__cxx11::string::find((char *)local_50,0x471ad8);
    if (lVar2 == -1) {
      cmSystemTools::Error
                ("TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp:",
                 binDir,(char *)0x0,(char *)0x0);
    }
    else {
      cmsys::Directory::Directory(&DStack_d8);
      std::__cxx11::string::string((string *)local_a0,binDir,(allocator *)&local_c0);
      local_c8 = binDir;
      cmsys::Directory::Load(&DStack_d8,(string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      local_a0._24_8_ = local_a0 + 8;
      local_a0._8_4_ = _S_red;
      local_a0._16_8_ = 0;
      local_78 = 0;
      dindex = 0;
      local_80 = (_Base_ptr)local_a0._24_8_;
      while( true ) {
        uVar3 = cmsys::Directory::GetNumberOfFiles(&DStack_d8);
        if (uVar3 <= dindex) break;
        pcVar4 = cmsys::Directory::GetFile(&DStack_d8,dindex);
        if ((*pcVar4 != '.') || (pcVar4[1] != '\0')) {
          pcVar4 = cmsys::Directory::GetFile(&DStack_d8,dindex);
          if ((*pcVar4 != '.') || ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))) {
            pcVar4 = cmsys::Directory::GetFile(&DStack_d8,dindex);
            std::__cxx11::string::string((string *)&local_c0,pcVar4,(allocator *)&local_70);
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a0,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            if (iVar5._M_node == (_Base_ptr)(local_a0 + 8)) {
              pcVar4 = cmsys::Directory::GetFile(&DStack_d8,dindex);
              std::__cxx11::string::string((string *)&local_c0,pcVar4,(allocator *)&local_70);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_a0,&local_c0);
              std::__cxx11::string::~string((string *)&local_c0);
              std::__cxx11::string::string((string *)&local_c0,local_c8,(allocator *)&local_70);
              std::__cxx11::string::append((char *)&local_c0);
              cmsys::Directory::GetFile(&DStack_d8,dindex);
              std::__cxx11::string::append((char *)&local_c0);
              bVar1 = cmsys::SystemTools::FileIsDirectory(&local_c0);
              if (bVar1) {
                CleanupFiles(local_d0,local_c0._M_dataplus._M_p);
                cmsys::SystemTools::RemoveADirectory(&local_c0);
              }
              else {
                bVar1 = cmsys::SystemTools::RemoveFile(&local_c0);
                if (!bVar1) {
                  std::operator+(&local_70,"Remove failed on file: ",&local_c0);
                  cmSystemTools::ReportLastSystemError(local_70._M_dataplus._M_p);
                  std::__cxx11::string::~string((string *)&local_70);
                }
              }
              std::__cxx11::string::~string((string *)&local_c0);
            }
          }
        }
        dindex = dindex + 1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a0);
      cmsys::Directory::~Directory(&DStack_d8);
    }
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(const char* binDir)
{
  if ( !binDir )
    {
    return;
    }

  std::string bdir = binDir;
  if(bdir.find("CMakeTmp") == std::string::npos)
    {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp:", binDir);
    return;
    }

  cmsys::Directory dir;
  dir.Load(binDir);
  size_t fileNum;
  std::set<std::string> deletedFiles;
  for (fileNum = 0; fileNum <  dir.GetNumberOfFiles(); ++fileNum)
    {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".."))
      {

      if(deletedFiles.find( dir.GetFile(static_cast<unsigned long>(fileNum)))
         == deletedFiles.end())
        {
        deletedFiles.insert(dir.GetFile(static_cast<unsigned long>(fileNum)));
        std::string fullPath = binDir;
        fullPath += "/";
        fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        if(cmSystemTools::FileIsDirectory(fullPath))
          {
          this->CleanupFiles(fullPath.c_str());
          cmSystemTools::RemoveADirectory(fullPath);
          }
        else
          {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          while(!cmSystemTools::RemoveFile(fullPath.c_str()) &&
                --retry.Count && cmSystemTools::FileExists(fullPath.c_str()))
            {
            cmSystemTools::Delay(retry.Delay);
            }
          if(retry.Count == 0)
#else
          if(!cmSystemTools::RemoveFile(fullPath))
#endif
            {
            std::string m = "Remove failed on file: " + fullPath;
            cmSystemTools::ReportLastSystemError(m.c_str());
            }
          }
        }
      }
    }
}